

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_componentEqualDifferentOrderVariables_Test::
~Equality_componentEqualDifferentOrderVariables_Test
          (Equality_componentEqualDifferentOrderVariables_Test *this)

{
  Equality_componentEqualDifferentOrderVariables_Test *this_local;
  
  ~Equality_componentEqualDifferentOrderVariables_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, componentEqualDifferentOrderVariables)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create("c");
    libcellml::ComponentPtr c2 = libcellml::Component::create("c");

    libcellml::VariablePtr v1 = libcellml::Variable::create("vA");
    libcellml::VariablePtr v2 = libcellml::Variable::create("vB");
    libcellml::VariablePtr v3 = libcellml::Variable::create("vC");
    libcellml::VariablePtr v4 = libcellml::Variable::create("vA");
    libcellml::VariablePtr v5 = libcellml::Variable::create("vB");
    libcellml::VariablePtr v6 = libcellml::Variable::create("vC");

    c1->addVariable(v1);
    c1->addVariable(v2);
    c1->addVariable(v3);

    c2->addVariable(v6);
    c2->addVariable(v4);
    c2->addVariable(v5);

    EXPECT_TRUE(c1->equals(c2));
    EXPECT_TRUE(c2->equals(c1));
}